

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

CatalogEntryLookup * __thiscall
duckdb::Catalog::TryLookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogEntryRetriever *retriever
          ,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  AttachedDatabase *pAVar1;
  pointer pcVar2;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  bool bVar3;
  string *catalog_name;
  optional_ptr<duckdb::Catalog,_true> oVar4;
  CatalogType type;
  runtime_error *this_00;
  undefined3 in_register_00000089;
  pointer pCVar5;
  CatalogTransaction transaction;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  reference_set_t<SchemaCatalogEntry> schemas;
  undefined1 local_118 [32];
  transaction_t local_f8;
  ClientContext *local_f0;
  undefined4 local_e4;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_e0;
  pointer local_c8;
  CatalogEntryRetriever *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  SchemaCatalogEntry *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  undefined1 local_68 [32];
  float local_48;
  size_type local_40;
  char acStack_38 [8];
  
  local_e4 = CONCAT31(in_register_00000089,if_not_found);
  local_f0 = retriever->context;
  local_68._0_8_ = acStack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  acStack_38[0] = '\0';
  acStack_38[1] = '\0';
  acStack_38[2] = '\0';
  acStack_38[3] = '\0';
  acStack_38[4] = '\0';
  acStack_38[5] = '\0';
  acStack_38[6] = '\0';
  acStack_38[7] = '\0';
  bVar3 = IsInvalidSchema(schema);
  if (bVar3) {
    pAVar1 = this->db;
    local_118._0_8_ = local_118 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,anon_var_dwarf_643837b + 9);
    GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_e0,retriever,
                      &(pAVar1->super_CatalogEntry).name,(string *)local_118);
    local_c0 = retriever;
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_e0.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_e0.
        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_b8 = &(__return_storage_ptr__->error).final_message.field_2;
      pCVar5 = local_e0.
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        CatalogTransaction::CatalogTransaction((CatalogTransaction *)local_118,this,local_f0);
        transaction_00.context.ptr = (ClientContext *)local_118._8_8_;
        transaction_00.db.ptr = (DatabaseInstance *)local_118._0_8_;
        transaction_00.transaction.ptr = (Transaction *)local_118._16_8_;
        transaction_00.transaction_id = local_118._24_8_;
        transaction_00.start_time = local_f8;
        TryLookupEntryInternal
                  (__return_storage_ptr__,this,transaction_00,&pCVar5->schema,lookup_info);
        if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) {
          ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
          ~vector(&local_e0);
          goto LAB_00258efd;
        }
        if ((__return_storage_ptr__->schema).ptr != (SchemaCatalogEntry *)0x0) {
          optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
                    (&__return_storage_ptr__->schema);
          local_b0 = (__return_storage_ptr__->schema).ptr;
          local_c8 = (pointer)local_68;
          ::std::
          _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::SchemaCatalogEntry>,true>>>>
                    ((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_c8,&local_b0,&local_c8);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&(__return_storage_ptr__->error).extra_info);
        pcVar2 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != local_b8) {
          operator_delete(pcVar2);
        }
        pcVar2 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(__return_storage_ptr__->error).raw_message.field_2) {
          operator_delete(pcVar2);
        }
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != local_e0.
                         super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
              (&local_e0);
    retriever = local_c0;
  }
  else {
    CatalogTransaction::CatalogTransaction((CatalogTransaction *)local_118,this,local_f0);
    transaction_01.context.ptr = (ClientContext *)local_118._8_8_;
    transaction_01.db.ptr = (DatabaseInstance *)local_118._0_8_;
    transaction_01.transaction.ptr = (Transaction *)local_118._16_8_;
    transaction_01.transaction_id = local_118._24_8_;
    transaction_01.start_time = local_f8;
    TryLookupEntryInternal(__return_storage_ptr__,this,transaction_01,schema,lookup_info);
    if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) goto LAB_00258efd;
    if ((__return_storage_ptr__->schema).ptr != (SchemaCatalogEntry *)0x0) {
      optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&__return_storage_ptr__->schema);
      local_c8 = (pointer)(__return_storage_ptr__->schema).ptr;
      local_e0.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::SchemaCatalogEntry>,true>>>>
                ();
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&(__return_storage_ptr__->error).extra_info);
    pcVar2 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(__return_storage_ptr__->error).final_message.field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(__return_storage_ptr__->error).raw_message.field_2) {
      operator_delete(pcVar2);
    }
  }
  if ((char)local_e4 == '\x01') {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    ErrorData::ErrorData(&__return_storage_ptr__->error);
  }
  else {
    catalog_name = DatabaseManager::GetDefaultDatabase_abi_cxx11_(retriever->context);
    oVar4 = GetCatalogEntry(local_f0,catalog_name);
    if (oVar4.ptr == (Catalog *)0x0) {
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"%s with name %s does not exist!","");
      CatalogTypeToString_abi_cxx11_(&local_88,(duckdb *)(ulong)lookup_info->catalog_type,type);
      pcVar2 = (lookup_info->name->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + lookup_info->name->_M_string_length);
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                ((CatalogException *)&local_e0,(string *)local_118,&local_88,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
      ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)&local_e0);
      this_00 = (runtime_error *)&local_e0;
    }
    else {
      CreateMissingEntryException
                ((CatalogException *)local_118,retriever,lookup_info,
                 (reference_set_t<SchemaCatalogEntry> *)local_68);
      (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
      ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)local_118);
      this_00 = (runtime_error *)local_118;
    }
    ::std::runtime_error::~runtime_error(this_00);
  }
LAB_00258efd:
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntry(CatalogEntryRetriever &retriever, const string &schema,
                                           const EntryLookupInfo &lookup_info, OnEntryNotFound if_not_found) {
	auto &context = retriever.GetContext();
	reference_set_t<SchemaCatalogEntry> schemas;
	if (IsInvalidSchema(schema)) {
		// try all schemas for this catalog
		auto entries = GetCatalogEntries(retriever, GetName(), INVALID_SCHEMA);
		for (auto &entry : entries) {
			auto &candidate_schema = entry.schema;
			auto transaction = GetCatalogTransaction(context);
			auto result = TryLookupEntryInternal(transaction, candidate_schema, lookup_info);
			if (result.Found()) {
				return result;
			}
			if (result.schema) {
				schemas.insert(*result.schema);
			}
		}
	} else {
		auto transaction = GetCatalogTransaction(context);
		auto result = TryLookupEntryInternal(transaction, schema, lookup_info);
		if (result.Found()) {
			return result;
		}
		if (result.schema) {
			schemas.insert(*result.schema);
		}
	}

	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		return {nullptr, nullptr, ErrorData()};
	}
	// Check if the default database is actually attached. CreateMissingEntryException will throw binder exception
	// otherwise.
	if (!GetCatalogEntry(context, GetDefaultCatalog(retriever))) {
		auto except = CatalogException("%s with name %s does not exist!",
		                               CatalogTypeToString(lookup_info.GetCatalogType()), lookup_info.GetEntryName());
		return {nullptr, nullptr, ErrorData(except)};
	} else {
		auto except = CreateMissingEntryException(retriever, lookup_info, schemas);
		return {nullptr, nullptr, ErrorData(except)};
	}
}